

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_fill_emit(jit_State *J,CRecMemList *ml,MSize mlp,TRef trdst,TRef trfill)

{
  TRef TVar1;
  TRef trdptr;
  TRef trofs;
  MSize i;
  TRef trfill_local;
  TRef trdst_local;
  MSize mlp_local;
  CRecMemList *ml_local;
  jit_State *J_local;
  
  for (trdptr = 0; trdptr < mlp; trdptr = trdptr + 1) {
    TVar1 = lj_ir_kint64(J,(ulong)ml[trdptr].ofs);
    (J->fold).ins.field_0.ot = 0x2909;
    (J->fold).ins.field_0.op1 = (IRRef1)trdst;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    TVar1 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = (ushort)ml[trdptr].tp | 0x4e00;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)trfill;
    lj_opt_fold(J);
  }
  return;
}

Assistant:

static void crec_fill_emit(jit_State *J, CRecMemList *ml, MSize mlp,
			   TRef trdst, TRef trfill)
{
  MSize i;
  for (i = 0; i < mlp; i++) {
    TRef trofs = lj_ir_kintp(J, ml[i].ofs);
    TRef trdptr = emitir(IRT(IR_ADD, IRT_PTR), trdst, trofs);
    emitir(IRT(IR_XSTORE, ml[i].tp), trdptr, trfill);
  }
}